

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

string * __thiscall
duckdb::CSVErrorTypeToEnum_abi_cxx11_(string *__return_storage_ptr__,duckdb *this,CSVErrorType type)

{
  InternalException *this_00;
  undefined7 in_register_00000011;
  char *pcVar1;
  allocator local_39;
  string local_38;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar1 = "CAST";
    break;
  default:
    this_00 = (InternalException *)
              __cxa_allocate_exception(0x10,this,CONCAT71(in_register_00000011,type));
    ::std::__cxx11::string::string
              ((string *)&local_38,"CSV Error is not valid to be stored in a Rejects Table",
               &local_39);
    InternalException::InternalException(this_00,&local_38);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 2:
    pcVar1 = "MISSING COLUMNS";
    break;
  case 3:
    pcVar1 = "TOO MANY COLUMNS";
    break;
  case 4:
    pcVar1 = "UNQUOTED VALUE";
    break;
  case 6:
    pcVar1 = "LINE SIZE OVER MAXIMUM";
    break;
  case 8:
    pcVar1 = "INVALID UNICODE";
    break;
  case 9:
    pcVar1 = "INVALID STATE";
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string CSVErrorTypeToEnum(CSVErrorType type) {
	switch (type) {
	case CSVErrorType::CAST_ERROR:
		return "CAST";
	case CSVErrorType::TOO_FEW_COLUMNS:
		return "MISSING COLUMNS";
	case CSVErrorType::TOO_MANY_COLUMNS:
		return "TOO MANY COLUMNS";
	case CSVErrorType::MAXIMUM_LINE_SIZE:
		return "LINE SIZE OVER MAXIMUM";
	case CSVErrorType::UNTERMINATED_QUOTES:
		return "UNQUOTED VALUE";
	case CSVErrorType::INVALID_UNICODE:
		return "INVALID UNICODE";
	case CSVErrorType::INVALID_STATE:
		return "INVALID STATE";
	default:
		throw InternalException("CSV Error is not valid to be stored in a Rejects Table");
	}
}